

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O0

int Cnf_ManScanMapping_rec(Cnf_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vMapped,int fPreorder)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  Vec_Ptr_t *vSuper_00;
  Aig_Obj_t *pAVar4;
  bool bVar5;
  Vec_Ptr_t *vSuper;
  int i;
  int aArea;
  Cnf_Cut_t *pCutBest;
  Aig_Obj_t *pLeaf;
  int fPreorder_local;
  Vec_Ptr_t *vMapped_local;
  Aig_Obj_t *pObj_local;
  Cnf_Man_t *p_local;
  
  uVar3 = *(ulong *)&pObj->field_0x18 >> 6;
  *(ulong *)&pObj->field_0x18 =
       *(ulong *)&pObj->field_0x18 & 0xffffffff0000003f |
       ((ulong)(((uint)uVar3 & 0x3ffffff) + 1) & 0x3ffffff) << 6;
  if ((((uVar3 & 0x3ffffff) == 0) && (iVar2 = Aig_ObjIsCi(pObj), iVar2 == 0)) &&
     (iVar2 = Aig_ObjIsConst1(pObj), iVar2 == 0)) {
    iVar2 = Aig_ObjIsAnd(pObj);
    if (iVar2 == 0) {
      __assert_fail("Aig_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfUtil.c"
                    ,0x7f,"int Cnf_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, int)");
    }
    if ((pObj->field_5).pData == (void *)0x0) {
      __assert_fail("pObj->pData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfUtil.c"
                    ,0x80,"int Cnf_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, int)");
    }
    if ((vMapped != (Vec_Ptr_t *)0x0) && (fPreorder != 0)) {
      Vec_PtrPush(vMapped,pObj);
    }
    if ((*(ulong *)&pObj->field_0x18 >> 5 & 1) == 0) {
      pcVar1 = (char *)(pObj->field_5).pData;
      if ('~' < pcVar1[1]) {
        __assert_fail("pCutBest->Cost < 127",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfUtil.c"
                      ,0x94,"int Cnf_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, int)"
                     );
      }
      vSuper._4_4_ = (int)pcVar1[1];
      vSuper._0_4_ = 0;
      while( true ) {
        bVar5 = false;
        if ((int)vSuper < *pcVar1) {
          pCutBest = (Cnf_Cut_t *)
                     Aig_ManObj(p->pManAig,*(int *)(pcVar1 + (long)(int)vSuper * 4 + 0x18));
          bVar5 = (Aig_Obj_t *)pCutBest != (Aig_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar2 = Cnf_ManScanMapping_rec(p,(Aig_Obj_t *)pCutBest,vMapped,fPreorder);
        vSuper._4_4_ = iVar2 + vSuper._4_4_;
        vSuper._0_4_ = (int)vSuper + 1;
      }
    }
    else {
      vSuper_00 = Vec_PtrAlloc(100);
      Aig_ObjCollectSuper(pObj,vSuper_00);
      iVar2 = Vec_PtrSize(vSuper_00);
      vSuper._4_4_ = iVar2 + 1;
      for (vSuper._0_4_ = 0; iVar2 = Vec_PtrSize(vSuper_00), (int)vSuper < iVar2;
          vSuper._0_4_ = (int)vSuper + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vSuper_00,(int)vSuper);
        pAVar4 = Aig_Regular(pAVar4);
        iVar2 = Cnf_ManScanMapping_rec(p,pAVar4,vMapped,fPreorder);
        vSuper._4_4_ = iVar2 + vSuper._4_4_;
      }
      Vec_PtrFree(vSuper_00);
      *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf | 0x20;
    }
    if ((vMapped != (Vec_Ptr_t *)0x0) && (fPreorder == 0)) {
      Vec_PtrPush(vMapped,pObj);
    }
    p_local._4_4_ = vSuper._4_4_;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Cnf_ManScanMapping_rec( Cnf_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vMapped, int fPreorder )
{
    Aig_Obj_t * pLeaf;
    Cnf_Cut_t * pCutBest;
    int aArea, i;
    if ( pObj->nRefs++ || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return 0;
    assert( Aig_ObjIsAnd(pObj) );
    assert( pObj->pData != NULL );
    // add the node to the mapping
    if ( vMapped && fPreorder )
         Vec_PtrPush( vMapped, pObj );
    // visit the transitive fanin of the selected cut
    if ( pObj->fMarkB )
    {
        Vec_Ptr_t * vSuper = Vec_PtrAlloc( 100 );
        Aig_ObjCollectSuper( pObj, vSuper );
        aArea = Vec_PtrSize(vSuper) + 1;
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
            aArea += Cnf_ManScanMapping_rec( p, Aig_Regular(pLeaf), vMapped, fPreorder );
        Vec_PtrFree( vSuper );
        ////////////////////////////
        pObj->fMarkB = 1;
    }
    else
    {
        pCutBest = (Cnf_Cut_t *)pObj->pData;
//        assert( pCutBest->nFanins > 0 );
        assert( pCutBest->Cost < 127 );
        aArea = pCutBest->Cost;
        Cnf_CutForEachLeaf( p->pManAig, pCutBest, pLeaf, i )
            aArea += Cnf_ManScanMapping_rec( p, pLeaf, vMapped, fPreorder );
    }
    // add the node to the mapping
    if ( vMapped && !fPreorder )
         Vec_PtrPush( vMapped, pObj );
    return aArea;
}